

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::MergeFromImpl<false>
          (internal *this,string_view input,MessageLite *msg,TcParseTableBase *tc_table,
          ParseFlags parse_flags)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ushort *puVar4;
  MessageLite *this_00;
  string_view flat;
  ushort *local_a0;
  EpsCopyInputStream local_98;
  undefined4 local_40;
  int local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  this_00 = (MessageLite *)input._M_str;
  local_98.zcis_ = (ZeroCopyInputStream *)0x0;
  local_98.patch_buffer_[0] = '\0';
  local_98.patch_buffer_[1] = '\0';
  local_98.patch_buffer_[2] = '\0';
  local_98.patch_buffer_[3] = '\0';
  local_98.patch_buffer_[4] = '\0';
  local_98.patch_buffer_[5] = '\0';
  local_98.patch_buffer_[6] = '\0';
  local_98.patch_buffer_[7] = '\0';
  local_98.patch_buffer_[8] = '\0';
  local_98.patch_buffer_[9] = '\0';
  local_98.patch_buffer_[10] = '\0';
  local_98.patch_buffer_[0xb] = '\0';
  local_98.patch_buffer_[0xc] = '\0';
  local_98.patch_buffer_[0xd] = '\0';
  local_98.patch_buffer_[0xe] = '\0';
  local_98.patch_buffer_[0xf] = '\0';
  local_98.patch_buffer_[0x10] = '\0';
  local_98.patch_buffer_[0x11] = '\0';
  local_98.patch_buffer_[0x12] = '\0';
  local_98.patch_buffer_[0x13] = '\0';
  local_98.patch_buffer_[0x14] = '\0';
  local_98.patch_buffer_[0x15] = '\0';
  local_98.patch_buffer_[0x16] = '\0';
  local_98.patch_buffer_[0x17] = '\0';
  local_98.patch_buffer_[0x18] = '\0';
  local_98.patch_buffer_[0x19] = '\0';
  local_98.patch_buffer_[0x1a] = '\0';
  local_98.patch_buffer_[0x1b] = '\0';
  local_98.patch_buffer_[0x1c] = '\0';
  local_98.patch_buffer_[0x1d] = '\0';
  local_98.patch_buffer_[0x1e] = '\0';
  local_98.patch_buffer_[0x1f] = '\0';
  local_98.aliasing_ = 0;
  local_98.last_tag_minus_1_ = 0;
  local_98.overall_limit_ = 0x7fffffff;
  local_40 = _default_recursion_limit_;
  local_3c = -0x80000000;
  local_38 = 0;
  uStack_30 = 0;
  flat._M_str = (char *)input._M_len;
  flat._M_len = (size_t)this;
  local_a0 = (ushort *)EpsCopyInputStream::InitFrom(&local_98,flat);
  while (bVar1 = EpsCopyInputStream::DoneWithCheck(&local_98,(char **)&local_a0,local_3c), !bVar1) {
    uVar2 = (uint)(byte)(msg->_internal_metadata_).ptr_ & (uint)*local_a0;
    if ((uVar2 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    uVar3 = (ulong)(uVar2 & 0xfffffff8);
    local_a0 = (ushort *)
               (**(code **)((long)&msg[3]._internal_metadata_.ptr_ + uVar3 * 2))
                         (this_00,local_a0,&local_98,
                          (ulong)*local_a0 ^ *(ulong *)((long)&msg[4]._vptr_MessageLite + uVar3 * 2)
                          ,msg,0);
    if ((local_a0 == (ushort *)0x0) || (local_98.last_tag_minus_1_ != 0)) break;
  }
  puVar4 = local_a0;
  if (((msg->_internal_metadata_).ptr_ & 0x100) != 0) {
    puVar4 = (ushort *)(*(code *)msg[2]._internal_metadata_.ptr_)(this_00,local_a0,&local_98);
  }
  bVar1 = false;
  if ((puVar4 != (ushort *)0x0) && (bVar1 = false, local_98.last_tag_minus_1_ == 0)) {
    if (((ulong)tc_table & 2) == 0) {
      bVar1 = MessageLite::IsInitializedWithErrors(this_00);
    }
    else {
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool MergeFromImpl(absl::string_view input, MessageLite* msg,
                   const internal::TcParseTableBase* tc_table,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = internal::TcParser::ParseLoop(msg, ptr, &ctx, tc_table);
  // ctx has an explicit limit set (length of string_view).
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}